

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::SingularVarBigint<long,unsigned_short,true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint64_t uVar1;
  MessageLite *pMVar2;
  TcParseTableBase *this;
  ParseContext *pPVar3;
  int8_t iVar4;
  byte bVar5;
  bool bVar6;
  uint16_t uVar7;
  unsigned_short uVar8;
  uint uVar9;
  char *pcVar10;
  int64_t iVar11;
  long *plVar12;
  uint *puVar13;
  ulong uVar14;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_308 [2];
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_2f8;
  int64_t local_2f0;
  uint64_t tmp;
  Spill spill;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  TcFieldData local_290;
  TcFieldData local_288;
  undefined1 local_279;
  uint64_t uStack_278;
  bool always_return;
  TcParseTableBase *local_270;
  ParseContext *local_268;
  char *local_260;
  MessageLite *local_258;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_250;
  ulong local_248;
  int64_t res;
  char *local_238;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_230;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_228;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  ulong local_188;
  int64_t res3;
  int64_t res2;
  anon_class_8_1_54a39810 last;
  anon_class_8_1_54a39810 next;
  bool kIs32BitVarint;
  bool kIs64BitVarint;
  char *local_158;
  char *local_150;
  int64_t *local_148;
  int8_t local_131;
  ulong *local_130;
  int8_t local_119;
  int64_t *local_118;
  int8_t local_101;
  ulong *local_100;
  int8_t local_e9;
  int8_t local_d9;
  int8_t local_c9;
  int8_t local_b9;
  int8_t local_a9;
  int64_t *local_a8;
  int8_t local_91;
  ulong *local_90;
  int8_t local_79;
  int64_t *local_78;
  int8_t local_61;
  ulong *local_60;
  int8_t local_49;
  int8_t local_39;
  int8_t local_29;
  int8_t local_19;
  int8_t local_9;
  
  tmp = (uint64_t)data.field_0;
  spill.field_data = (uint64_t)msg;
  spill.msg = (MessageLite *)table;
  spill.table = (TcParseTableBase *)hasbits;
  spill.hasbits = hasbits;
  msg_local = (MessageLite *)data.field_0;
  if (-1 < *ptr) {
    protobuf_assumption_failed
              ("static_cast<int8_t>(*ptr) < 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x31c);
  }
  res = (int64_t)&local_2f0;
  last.p = &local_158;
  res2 = (int64_t)&local_158;
  local_238 = ptr;
  local_158 = ptr;
  iVar4 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()(&last);
  local_248 = (ulong)iVar4;
  if (iVar4 < '\0') {
    local_131 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()(&last);
    local_148 = &res3;
    res3 = (long)local_131 << 7 | local_248 >> 0x39;
    local_d9 = local_131;
    if (res3 < 0) {
      local_119 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()(&last)
      ;
      local_130 = &local_188;
      local_188 = (long)local_119 << 0xe | local_248 >> 0x32;
      local_c9 = local_119;
      if ((long)local_188 < 0) {
        local_101 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                              (&last);
        local_118 = &res3;
        res3 = ((long)local_101 << 0x15 | local_248 >> 0x2b) & res3;
        local_b9 = local_101;
        if (res3 < 0) {
          local_e9 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                               (&last);
          local_100 = &local_188;
          local_188 = ((long)local_e9 << 0x1c | local_248 >> 0x24) & local_188;
          local_a9 = local_e9;
          if ((long)local_188 < 0) {
            local_91 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                 (&last);
            local_a8 = &res3;
            res3 = ((long)local_91 << 0x23 | local_248 >> 0x1d) & res3;
            local_39 = local_91;
            if (res3 < 0) {
              local_79 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                   (&last);
              local_90 = &local_188;
              local_188 = ((long)local_79 << 0x2a | local_248 >> 0x16) & local_188;
              local_29 = local_79;
              if ((long)local_188 < 0) {
                local_61 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                           operator()(&last);
                local_78 = &res3;
                res3 = ((long)local_61 << 0x31 | local_248 >> 0xf) & res3;
                local_19 = local_61;
                if (res3 < 0) {
                  local_49 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                             operator()(&last);
                  local_60 = &local_188;
                  local_188 = ((long)local_49 << 0x38 | local_248 >> 8) & local_188;
                  local_9 = local_49;
                  if (((long)local_188 < 0) &&
                     (iVar4 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                              operator()(&last), iVar4 != '\x01')) {
                    iVar4 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                            operator()((anon_class_8_1_54a39810 *)&res2);
                    if (((int)iVar4 & 0x80U) != 0) {
                      local_150 = (char *)0x0;
                      goto LAB_0045eef3;
                    }
                    bVar5 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                            operator()((anon_class_8_1_54a39810 *)&res2);
                    if ((bVar5 & 1) == 0) {
                      local_188 = local_188 ^ 0x8000000000000000;
                    }
                  }
                }
              }
            }
          }
        }
      }
      res3 = local_188 & res3;
    }
    local_248 = res3 & local_248;
    if (local_158 == (char *)0x0) {
      protobuf_assumption_failed
                ("p != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/varint_shuffle.h"
                 ,0x91);
    }
    local_150 = local_158;
  }
  else {
    local_150 = local_158;
  }
LAB_0045eef3:
  local_238 = local_150;
  *(ulong *)res = local_248;
  pcVar10 = local_238;
  pMVar2 = spill.msg;
  uVar1 = spill.field_data;
  msg_local = (MessageLite *)tmp;
  spill.hasbits = (uint64_t)spill.table;
  if (local_238 == (char *)0x0) {
    TcFieldData::TcFieldData((TcFieldData *)&local_2f8);
    pcVar10 = Error((MessageLite *)uVar1,(char *)0x0,ctx,(TcFieldData)local_2f8,
                    (TcParseTableBase *)pMVar2,spill.hasbits);
    return pcVar10;
  }
  iVar11 = (anonymous_namespace)::ZigZagDecodeHelper<long,true>(local_2f0);
  uVar7 = TcFieldData::offset((TcFieldData *)&msg_local);
  plVar12 = RefAt<long>((void *)uVar1,(ulong)uVar7);
  *plVar12 = iVar11;
  TcFieldData::TcFieldData((TcFieldData *)local_308);
  local_250 = local_308[0];
  local_258 = (MessageLite *)uVar1;
  local_260 = pcVar10;
  local_270 = (TcParseTableBase *)pMVar2;
  uStack_278 = spill.hasbits;
  local_279 = 0;
  local_268 = ctx;
  bVar6 = EpsCopyInputStream::DataAvailable(&ctx->super_EpsCopyInputStream,pcVar10);
  pMVar2 = local_258;
  pcVar10 = local_260;
  pPVar3 = local_268;
  if (bVar6) {
    TcFieldData::TcFieldData(&local_290);
    this = local_270;
    uVar1 = uStack_278;
    uVar8 = UnalignedLoad<unsigned_short>(pcVar10);
    uVar14 = (ulong)(int)((uint)uVar8 & (uint)this->fast_idx_mask);
    if ((uVar14 & 7) == 0) {
      data_1.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)TcParseTableBase::fast_entry(this,uVar14 >> 3)
      ;
      local_228.data =
           ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
           (ulong)uVar8;
      UNRECOVERED_JUMPTABLE =
           TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
      local_230.data = local_228.data;
      pcVar10 = (*UNRECOVERED_JUMPTABLE)(pMVar2,pcVar10,pPVar3,(TcFieldData)local_228,this,uVar1);
      return pcVar10;
    }
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  TcFieldData::TcFieldData(&local_288);
  if (local_270->has_bits_offset != 0) {
    uVar9 = (uint)uStack_278;
    puVar13 = RefAt<unsigned_int>(pMVar2,(ulong)(uint)local_270->has_bits_offset);
    *puVar13 = uVar9 | *puVar13;
  }
  return pcVar10;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::SingularVarBigint(
    PROTOBUF_TC_PARAM_DECL) {
  // For some reason clang wants to save 5 registers to the stack here,
  // but we only need four for this code, so save the data we don't need
  // to the stack.  Happily, saving them this way uses regular store
  // instructions rather than PUSH/POP, which saves time at the cost of greater
  // code size, but for this heavily-used piece of code, that's fine.
  struct Spill {
    uint64_t field_data;
    ::google::protobuf::MessageLite* msg;
    const ::google::protobuf::internal::TcParseTableBase* table;
    uint64_t hasbits;
  };
  Spill spill = {data.data, msg, table, hasbits};
#if defined(__GNUC__)
  // This empty asm block convinces the compiler that the contents of spill may
  // have changed, and thus can't be cached in registers.  It's similar to, but
  // more optimal than, the effect of declaring it "volatile".
  asm("" : "+m"(spill));
#endif

  uint64_t tmp;
  PROTOBUF_ASSUME(static_cast<int8_t>(*ptr) < 0);
  ptr = ParseVarint(ptr, &tmp);

  data.data = spill.field_data;
  msg = spill.msg;
  table = spill.table;
  hasbits = spill.hasbits;

  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  RefAt<FieldType>(msg, data.offset()) =
      ZigZagDecodeHelper<FieldType, zigzag>(tmp);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}